

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<char[20],unsigned_long,bool>
               (ostream *out,char *fmt,char (*args) [20],unsigned_long *args_1,bool *args_2)

{
  long in_FS_OFFSET;
  FormatList local_60;
  FormatArg local_50;
  unsigned_long *local_38;
  code *local_30;
  code *local_28;
  bool *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.m_args = &local_50;
  local_60.m_N = 3;
  local_50.m_formatImpl = detail::FormatArg::formatImpl<char[20]>;
  local_50.m_toIntImpl = detail::FormatArg::toIntImpl<char[20]>;
  local_30 = detail::FormatArg::formatImpl<unsigned_long>;
  local_28 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_18 = detail::FormatArg::formatImpl<bool>;
  local_10 = detail::FormatArg::toIntImpl<bool>;
  local_50.m_value = args;
  local_38 = args_1;
  local_20 = args_2;
  vformat(out,fmt,&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}